

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Own<kj::Directory,_std::nullptr_t> __thiscall
kj::newInMemoryDirectory(kj *this,Clock *clock,InMemoryFileFactory *fileFactory)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  Directory *extraout_RDX;
  AtomicRefcounted *refcounted;
  Own<kj::Directory,_std::nullptr_t> OVar3;
  Own<kj::(anonymous_namespace)::InMemoryDirectory,_std::nullptr_t> local_40;
  
  puVar1 = (undefined8 *)operator_new(0x78);
  *(undefined4 *)(puVar1 + 2) = 0;
  *puVar1 = &PTR_getFd_00278ff8;
  puVar1[1] = &PTR_disposeImpl_002790d0;
  _::Mutex::Mutex((Mutex *)(puVar1 + 3));
  puVar1[6] = clock;
  puVar1[7] = fileFactory;
  *(undefined4 *)(puVar1 + 9) = 0;
  puVar1[10] = 0;
  puVar1[0xb] = puVar1 + 9;
  puVar1[0xc] = puVar1 + 9;
  puVar1[0xd] = 0;
  uVar2 = (*(code *)**(undefined8 **)clock)(clock);
  puVar1[0xe] = uVar2;
  LOCK();
  *(int *)(puVar1 + 2) = *(int *)(puVar1 + 2) + 1;
  UNLOCK();
  *(Disposer **)this = (Disposer *)(puVar1 + 1);
  *(undefined8 **)(this + 8) = puVar1;
  local_40.ptr = (InMemoryDirectory *)0x0;
  local_40.disposer = (Disposer *)(puVar1 + 1);
  Own<kj::(anonymous_namespace)::InMemoryDirectory,_std::nullptr_t>::~Own(&local_40);
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<Directory> newInMemoryDirectory(const Clock& clock, const InMemoryFileFactory& fileFactory) {
  return atomicRefcounted<InMemoryDirectory>(clock, fileFactory);
}